

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_cw_lc_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  void *pvVar1;
  CURLcode CVar2;
  void *pvVar3;
  int iVar4;
  Curl_cwriter *writer_00;
  ulong nbytes;
  int chunk_type;
  CURLcode local_38;
  
  if (((type & 1U) == 0) || ((data->conn->proto).ftpc.transfertype != 'A')) {
    writer_00 = writer->next;
  }
  else {
    pvVar1 = writer->ctx;
    do {
      if (blen == 0) {
        blen = 0;
        goto LAB_0012e156;
      }
      if (*(char *)((long)pvVar1 + 0x20) == '\x01') {
        if ((*buf == '\n') ||
           (CVar2 = Curl_cwriter_write(data,writer->next,type & 0xffffff7fU,"\n",1),
           CVar2 == CURLE_OK)) {
          *(undefined1 *)((long)pvVar1 + 0x20) = 0;
          goto LAB_0012e0bc;
        }
LAB_0012e0fa:
        iVar4 = 1;
        local_38 = CVar2;
      }
      else {
LAB_0012e0bc:
        pvVar3 = memchr(buf,0xd,blen);
        if (pvVar3 == (void *)0x0) {
          iVar4 = 3;
        }
        else {
          nbytes = (long)pvVar3 - (long)buf;
          if ((nbytes != 0) &&
             (CVar2 = Curl_cwriter_write(data,writer->next,type & 0xffffff7fU,buf,nbytes),
             CVar2 != CURLE_OK)) goto LAB_0012e0fa;
          buf = (char *)((long)pvVar3 + 1);
          blen = blen + ~nbytes;
          *(undefined1 *)((long)pvVar1 + 0x20) = 1;
          iVar4 = 0;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 != 3) {
      return local_38;
    }
LAB_0012e156:
    if (blen == 0) {
      if (-1 < (char)type) {
        return CURLE_OK;
      }
      if (*(char *)((long)pvVar1 + 0x20) == '\x01') {
        *(undefined1 *)((long)pvVar1 + 0x20) = 0;
        writer_00 = writer->next;
        buf = "\n";
        blen = 1;
      }
      else {
        writer_00 = writer->next;
        blen = 0;
      }
    }
    else {
      writer_00 = writer->next;
    }
  }
  CVar2 = Curl_cwriter_write(data,writer_00,type,buf,blen);
  return CVar2;
}

Assistant:

static CURLcode ftp_cw_lc_write(struct Curl_easy *data,
                                struct Curl_cwriter *writer, int type,
                                const char *buf, size_t blen)
{
  static const char nl = '\n';
  struct ftp_cw_lc_ctx *ctx = writer->ctx;

  if(!(type & CLIENTWRITE_BODY) ||
     data->conn->proto.ftpc.transfertype != 'A')
    return Curl_cwriter_write(data, writer->next, type, buf, blen);

  /* ASCII mode BODY data, convert lineends */
  while(blen) {
    /* do not pass EOS when writing parts */
    int chunk_type = (type & ~CLIENTWRITE_EOS);
    const char *cp;
    size_t chunk_len;
    CURLcode result;

    if(ctx->newline_pending) {
      if(buf[0] != '\n') {
        /* previous chunk ended in '\r' and we do not see a '\n' in this one,
         * need to write a newline. */
        result = Curl_cwriter_write(data, writer->next, chunk_type, &nl, 1);
        if(result)
          return result;
      }
      /* either we just wrote the newline or it is part of the next
       * chunk of bytes we write. */
      ctx->newline_pending = FALSE;
    }

    cp = memchr(buf, '\r', blen);
    if(!cp)
      break;

    /* write the bytes before the '\r', excluding the '\r' */
    chunk_len = cp - buf;
    if(chunk_len) {
      result = Curl_cwriter_write(data, writer->next, chunk_type,
                                  buf, chunk_len);
      if(result)
        return result;
    }
    /* skip the '\r', we now have a newline pending */
    buf = cp + 1;
    blen = blen - chunk_len - 1;
    ctx->newline_pending = TRUE;
  }

  /* Any remaining data does not contain a '\r' */
  if(blen) {
    DEBUGASSERT(!ctx->newline_pending);
    return Curl_cwriter_write(data, writer->next, type, buf, blen);
  }
  else if(type & CLIENTWRITE_EOS) {
    /* EndOfStream, if we have a trailing cr, now is the time to write it */
    if(ctx->newline_pending) {
      ctx->newline_pending = FALSE;
      return Curl_cwriter_write(data, writer->next, type, &nl, 1);
    }
    /* Always pass on the EOS type indicator */
    return Curl_cwriter_write(data, writer->next, type, buf, 0);
  }
  return CURLE_OK;
}